

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *
Inferences::intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>
          (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *l,
          Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *r)

{
  size_t sVar1;
  size_t sVar2;
  Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *lhs;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RDX;
  size_t extraout_RDX;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RSI;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RDI;
  bool bVar3;
  uint roffs;
  uint loffs;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *out;
  uint outOffs;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_stack_ffffffffffffff78;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_stack_ffffffffffffff80;
  Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_ffffffffffffff88;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *local_50;
  uint local_30;
  uint local_2c;
  uint local_1c;
  
  sVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RSI);
  if (sVar1 == 0) {
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    sVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RDX);
    if (sVar1 == 0) {
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      local_1c = 0;
      sVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RSI);
      sVar2 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RDX);
      local_50 = in_RDX;
      if (sVar1 <= sVar2) {
        local_50 = in_RSI;
      }
      local_2c = 0;
      local_30 = 0;
      while( true ) {
        sVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RSI);
        bVar3 = false;
        if (local_2c < sVar1) {
          sVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::size(in_RDX);
          bVar3 = local_30 < sVar1;
          sVar1 = extraout_RDX;
        }
        if (!bVar3) break;
        lhs = &Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[]
                         (in_RSI,(ulong)local_2c)->
               super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ;
        Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[](in_RDX,(ulong)local_30);
        bVar3 = Lib::operator==(lhs,in_stack_ffffffffffffff88);
        if (bVar3) {
          in_stack_ffffffffffffff88 =
               &Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[]
                          (in_RSI,(ulong)local_2c)->
                super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          ;
          Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[]
                    (local_50,(ulong)local_1c);
          AnyNumber<Kernel::MonomFactor>::operator=
                    ((AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff80,
                     (AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff78);
          local_2c = local_2c + 1;
          local_30 = local_30 + 1;
          local_1c = local_1c + 1;
        }
        else {
          in_stack_ffffffffffffff80 =
               (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
               Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[]
                         (in_RSI,(ulong)local_2c);
          Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator[]
                    (in_RDX,(ulong)local_30);
          bVar3 = operator<((AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff80,
                            (AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff78);
          if (bVar3) {
            local_2c = local_2c + 1;
          }
          else {
            local_30 = local_30 + 1;
          }
        }
      }
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::truncate
                (local_50,(char *)(ulong)local_1c,sVar1);
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return in_RDI;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}